

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O2

copy_on_write<DerivedType> *
make_copy_on_write<DerivedType,int&>(copy_on_write<DerivedType> *__return_storage_ptr__,int *ts)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  copy_on_write<DerivedType> p;
  __uniq_ptr_impl<direct_shared_control_block<DerivedType,_DerivedType>,_std::default_delete<direct_shared_control_block<DerivedType,_DerivedType>_>_>
  local_18;
  
  p.ptr_ = (DerivedType *)0x0;
  p.cb_.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::make_unique<direct_shared_control_block<DerivedType,DerivedType>,int&>((int *)&local_18);
  std::__shared_ptr<shared_control_block<DerivedType>,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<shared_control_block<DerivedType>,(__gnu_cxx::_Lock_policy)2> *)&p,
             (unique_ptr<direct_shared_control_block<DerivedType,_DerivedType>,_std::default_delete<direct_shared_control_block<DerivedType,_DerivedType>_>_>
              *)&local_18);
  if (local_18._M_t.
      super__Tuple_impl<0UL,_direct_shared_control_block<DerivedType,_DerivedType>_*,_std::default_delete<direct_shared_control_block<DerivedType,_DerivedType>_>_>
      .super__Head_base<0UL,_direct_shared_control_block<DerivedType,_DerivedType>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_direct_shared_control_block<DerivedType,_DerivedType>_*,_std::default_delete<direct_shared_control_block<DerivedType,_DerivedType>_>_>
       )0x0) {
    (**(code **)(*(long *)local_18._M_t.
                          super__Tuple_impl<0UL,_direct_shared_control_block<DerivedType,_DerivedType>_*,_std::default_delete<direct_shared_control_block<DerivedType,_DerivedType>_>_>
                          .
                          super__Head_base<0UL,_direct_shared_control_block<DerivedType,_DerivedType>_*,_false>
                          ._M_head_impl + 8))();
  }
  iVar2 = (*((p.ptr_)->super_BaseType)._vptr_BaseType[3])();
  peVar1 = p.cb_.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  __return_storage_ptr__->ptr_ = (DerivedType *)CONCAT44(extraout_var,iVar2);
  p.cb_.super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->cb_).
  super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)p.ptr_;
  (__return_storage_ptr__->cb_).
  super___shared_ptr<shared_control_block<DerivedType>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar1;
  p.ptr_ = (DerivedType *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p.cb_);
  return __return_storage_ptr__;
}

Assistant:

copy_on_write<T> make_copy_on_write(Ts&&... ts)
{
  copy_on_write<T> p;
  p.cb_ = std::make_unique<direct_shared_control_block<T>>(std::forward<Ts>(ts)...);
  p.ptr_ = p.cb_->ptr();
  return std::move(p);
}